

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxStructMember::FxStructMember
          (FxStructMember *this,FxExpression *x,PField *mem,FScriptPosition *pos)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StructMember,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStructMember_007069c8;
  this->classx = x;
  this->membervar = mem;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxStructMember::FxStructMember(FxExpression *x, PField* mem, const FScriptPosition &pos)
	: FxExpression(EFX_StructMember, pos)
{
	classx = x;
	membervar = mem;
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}